

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O2

iterator * __thiscall
idx2::Delete<unsigned_long,idx2::brick_volume>
          (iterator *__return_storage_ptr__,idx2 *this,
          hash_table<unsigned_long,_idx2::brick_volume> *Ht,unsigned_long *Key)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)((long)Ht->Keys * -0x61c8864680b583eb) >> (-(char)this[0x20] & 0x3fU);
  uVar2 = uVar3;
  do {
    if (*(char *)(*(long *)(this + 0x10) + uVar2) == '\0') break;
    lVar1 = *(long *)this;
    if (*(unsigned_long **)(lVar1 + uVar2 * 8) == Ht->Keys) {
      *(undefined1 *)(*(long *)(this + 0x10) + uVar2) = 1;
      *(long *)(this + 0x18) = *(long *)(this + 0x18) + -1;
      __return_storage_ptr__->Key = (unsigned_long *)(lVar1 + uVar2 * 8);
      __return_storage_ptr__->Val = (brick_volume *)(uVar2 * 0x40 + *(long *)(this + 8));
      __return_storage_ptr__->Ht = (hash_table<unsigned_long,_idx2::brick_volume> *)this;
      __return_storage_ptr__->Idx = uVar2;
      return __return_storage_ptr__;
    }
    uVar2 = uVar2 + 1 & ~(-1L << ((byte)this[0x20] & 0x3f));
  } while (uVar2 != uVar3);
  End<unsigned_long,idx2::brick_volume>((hash_table<unsigned_long,_idx2::brick_volume> *)this);
  return __return_storage_ptr__;
}

Assistant:

typename hash_table<k, v>::iterator
Delete(hash_table<k, v>* Ht, const k& Key)
{
  i64 H = Index(*Ht, Hash(Key));
  i64 Start = H;
  bool Found = false;
  while (Ht->Stats[H] != hash_table<k, v>::Empty)
  {
    if (Ht->Keys[H] == Key)
    {
      Ht->Stats[H] = hash_table<k, v>::Tombstone;
      --Ht->Size;
      idx2_Assert(Ht->Size >= 0);
      Found = true;
      return IterAt(*Ht, H);
    }
    ++H;
    if ((H &= Capacity(*Ht) - 1) == Start)
      break;
  }
  if (Found)
  {
    idx2_Assert(Ht->Keys[H] == Key);
  }
  idx2_Assert(Found);
  return End(*Ht);
}